

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.hpp
# Opt level: O0

void __thiscall
diy::
concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
::clear(concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
        *this)

{
  unique_lock<tthread::fast_mutex> *in_RDI;
  lock_guard<fast_mutex> l;
  mutex_type *in_stack_ffffffffffffffd8;
  
  Catch::clara::std::unique_lock<tthread::fast_mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffd8)
  ;
  Catch::clara::std::
  map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
  ::clear((map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
           *)0x1ac35b);
  Catch::clara::std::unique_lock<tthread::fast_mutex>::~unique_lock(in_RDI);
  return;
}

Assistant:

void            clear()                 { lock_guard<fast_mutex> l(mutex_); map_.clear(); }